

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_system(DisasContext_conflict1 *s,uint32_t insn)

{
  hook *hk;
  TCGv_ptr pTVar1;
  _Bool _Var2;
  uint uVar3;
  uint reg;
  int iVar4;
  uintptr_t o;
  TCGLabel *a1;
  ARMCPRegInfo_conflict *val;
  TCGv_i64 pTVar5;
  TCGv_i32 pTVar6;
  TCGv_i32 pTVar7;
  TCGv_i64 pTVar8;
  uc_struct_conflict2 *puVar9;
  uint uVar10;
  TCGBar TVar11;
  byte bVar12;
  uint val_00;
  uint uVar13;
  uint uVar14;
  TCGBar mb_type;
  uint32_t bits;
  TCGOpcode opc;
  code *pcVar15;
  uint uVar16;
  TCGContext_conflict1 *pTVar17;
  TCGArg a3;
  uintptr_t o_7;
  list_item *plVar18;
  uint uVar19;
  uint uVar20;
  uintptr_t o_8;
  TCGTemp *pTVar22;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGContext_conflict1 *local_40;
  ulong local_38;
  ulong uVar21;
  
  val_00 = insn >> 0x15 & 1;
  uVar19 = insn >> 0x13;
  uVar13 = insn >> 0x10 & 7;
  uVar20 = insn >> 0xc & 0xf;
  uVar21 = (ulong)uVar20;
  uVar14 = insn >> 8;
  uVar3 = uVar14 & 0xf;
  uVar10 = insn >> 5 & 7;
  local_48 = (TCGTemp *)(ulong)uVar10;
  reg = insn & 0x1f;
  uVar16 = uVar19 & 3;
  if (uVar16 != 0) {
    local_40 = s->uc->tcg_ctx;
    plVar18 = s->uc->hook[1].head;
    if (plVar18 != (list_item *)0x0) {
      bVar12 = (byte)val_00;
      local_38 = uVar21;
      do {
        uVar20 = (uint)uVar21;
        hk = (hook *)plVar18->data;
        if (hk == (hook *)0x0) break;
        if (hk->to_delete == false) {
          if (((s->pc_curr < hk->begin) || (hk->end < s->pc_curr)) && (hk->begin <= hk->end))
          goto LAB_006a239f;
          switch(hk->insn) {
          case 1:
            if (((byte)uVar19 >> 1 & bVar12) == 0) break;
LAB_006a2376:
            a1 = gen_hook_sys(s,insn,hk);
            uVar21 = local_38;
            goto LAB_006a239a;
          case 2:
            if ((uVar19 & 2) != 0 && bVar12 == 0) goto LAB_006a2376;
            break;
          case 3:
            if (uVar16 == 1 && bVar12 == 0) goto LAB_006a2376;
            break;
          case 4:
            if ((uVar16 == 1 & bVar12) != 0) goto LAB_006a2376;
          }
          a1 = (TCGLabel *)0x0;
LAB_006a239a:
          uVar20 = (uint)uVar21;
          if (a1 != (TCGLabel *)0x0) goto LAB_006a23ba;
        }
LAB_006a239f:
        uVar20 = (uint)uVar21;
        plVar18 = plVar18->next;
      } while (plVar18 != (list_item *)0x0);
    }
    a1 = (TCGLabel *)0x0;
LAB_006a23ba:
    val = get_arm_cp_reginfo_aarch64
                    (s->cp_regs,
                     (int)local_48 + (uVar20 << 7 | uVar13 << 0xb | uVar16 << 0xe) + uVar3 * 8 +
                     0x10130000);
    pTVar17 = local_40;
    if ((val == (ARMCPRegInfo_conflict *)0x0) ||
       (((uint)val->access >> (val_00 + s->current_el * 2 & 0x1f) & 1) == 0)) {
      unallocated_encoding_aarch64(s);
      if (a1 == (TCGLabel *)0x0) {
        return;
      }
      pTVar17 = s->uc->tcg_ctx;
      *(uint *)a1 = *(uint *)a1 | 1;
      tcg_gen_op1_aarch64(pTVar17,INDEX_op_set_label,(TCGArg)a1);
      return;
    }
    if (val->accessfn == (CPAccessFn_conflict *)0x0) {
      if ((val->type & 0x8000) != 0) {
        tcg_gen_op2_aarch64(local_40,INDEX_op_movi_i64,
                            (TCGArg)(local_40->cpu_pc_arm64 + (long)local_40),s->pc_curr);
      }
    }
    else {
      tcg_gen_op2_aarch64(local_40,INDEX_op_movi_i64,
                          (TCGArg)(local_40->cpu_pc_arm64 + (long)local_40),s->pc_curr);
      pTVar5 = tcg_const_i64_aarch64(pTVar17,(int64_t)val);
      pTVar6 = tcg_const_i32_aarch64
                         (pTVar17,(uVar20 << 10 |
                                  uVar13 << 0xe | uVar16 << 0x14 | (int)local_48 << 0x11) +
                                  uVar3 * 2 | reg << 5 | val_00 | 0x62000000);
      pTVar7 = tcg_const_i32_aarch64(pTVar17,val_00);
      local_68 = (TCGTemp *)(pTVar17->cpu_env + (long)pTVar17);
      local_60 = (TCGTemp *)(pTVar5 + (long)pTVar17);
      local_58 = (TCGTemp *)(pTVar6 + (long)pTVar17);
      local_50 = (TCGTemp *)(pTVar7 + (long)pTVar17);
      tcg_gen_callN_aarch64(pTVar17,helper_access_check_cp_reg_aarch64,(TCGTemp *)0x0,4,&local_68);
      tcg_temp_free_internal_aarch64(pTVar17,(TCGTemp *)(pTVar5 + (long)pTVar17));
      tcg_temp_free_internal_aarch64(pTVar17,(TCGTemp *)(pTVar6 + (long)pTVar17));
      tcg_temp_free_internal_aarch64(pTVar17,(TCGTemp *)(pTVar7 + (long)pTVar17));
    }
    uVar3 = val->type;
    uVar10 = (uVar3 & 0xfffe0f01) - 0x101;
    switch(uVar10 * 0x1000000 | uVar10 >> 8) {
    default:
      if ((uVar3 >> 0xc & 1) == 0) {
LAB_006a290d:
        if (((uVar3 >> 0xd & 1) == 0) || (_Var2 = sve_access_check_aarch64(s), _Var2)) {
          pTVar5 = cpu_reg_aarch64(s,reg);
          if (val_00 == 0) {
            if ((val->type & 2U) == 0) {
              if (val->writefn != (CPWriteFn_conflict *)0x0) {
                pTVar8 = tcg_const_i64_aarch64(pTVar17,(int64_t)val);
                pTVar1 = pTVar17->cpu_env;
                local_58 = (TCGTemp *)(pTVar5 + (long)pTVar17);
                pcVar15 = helper_set_cp_reg64_aarch64;
                pTVar22 = (TCGTemp *)0x0;
                iVar4 = 3;
                goto LAB_006a2a95;
              }
              a3 = val->fieldoffset;
              pTVar1 = pTVar17->cpu_env;
              opc = INDEX_op_st_i64;
LAB_006a2e58:
              tcg_gen_op3_aarch64(pTVar17,opc,(TCGArg)(pTVar5 + (long)pTVar17),
                                  (TCGArg)(pTVar1 + (long)pTVar17),a3);
              goto LAB_006a2e60;
            }
            if (a1 == (TCGLabel *)0x0) {
              return;
            }
            puVar9 = s->uc;
          }
          else {
            if ((val->type & 2U) == 0) {
              if (val->readfn == (CPReadFn_conflict *)0x0) {
                a3 = val->fieldoffset;
                pTVar1 = pTVar17->cpu_env;
                opc = INDEX_op_ld_i64;
                goto LAB_006a2e58;
              }
              pTVar8 = tcg_const_i64_aarch64(pTVar17,(int64_t)val);
              pTVar1 = pTVar17->cpu_env;
              pTVar22 = (TCGTemp *)(pTVar5 + (long)pTVar17);
              pcVar15 = helper_get_cp_reg64_aarch64;
              iVar4 = 2;
LAB_006a2a95:
              local_68 = (TCGTemp *)(pTVar1 + (long)pTVar17);
              local_60 = (TCGTemp *)(pTVar8 + (long)pTVar17);
              tcg_gen_callN_aarch64(pTVar17,pcVar15,pTVar22,iVar4,&local_68);
              tcg_temp_free_internal_aarch64(pTVar17,(TCGTemp *)(pTVar8 + (long)pTVar17));
            }
            else {
              tcg_gen_op2_aarch64(pTVar17,INDEX_op_movi_i64,(TCGArg)(pTVar5 + (long)pTVar17),
                                  val->resetvalue);
            }
LAB_006a2e60:
            if (((((s->base).tb)->cflags & 0x20000) != 0) && ((val->type & 0x40) != 0)) {
              (s->base).is_jmp = DISAS_TARGET_1;
            }
            if ((val_00 == 0) && ((val->type & 8) == 0)) {
              pTVar6 = tcg_const_i32_aarch64(pTVar17,s->current_el);
              local_68 = (TCGTemp *)(pTVar17->cpu_env + (long)pTVar17);
              local_60 = (TCGTemp *)(pTVar6 + (long)pTVar17);
              tcg_gen_callN_aarch64
                        (pTVar17,helper_rebuild_hflags_a64_aarch64,(TCGTemp *)0x0,2,&local_68);
              tcg_temp_free_internal_aarch64(pTVar17,(TCGTemp *)(pTVar6 + (long)pTVar17));
              (s->base).is_jmp = DISAS_TARGET_1;
            }
            if (a1 == (TCGLabel *)0x0) {
              return;
            }
            puVar9 = s->uc;
          }
          pTVar17 = puVar9->tcg_ctx;
          *(uint *)a1 = *(uint *)a1 | 1;
          goto LAB_006a29c9;
        }
        if (a1 == (TCGLabel *)0x0) {
          return;
        }
        puVar9 = s->uc;
      }
      else {
        if (s->fp_access_checked == true) {
          __assert_fail("!s->fp_access_checked",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                        ,0x487,"_Bool fp_access_check(DisasContext *)");
        }
        s->fp_access_checked = true;
        if (s->fp_excp_el == 0) goto LAB_006a290d;
        gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
        if (a1 == (TCGLabel *)0x0) {
          return;
        }
        puVar9 = s->uc;
      }
      goto LAB_006a29b6;
    case 2:
      pTVar5 = cpu_reg_aarch64(s,reg);
      if (val_00 == 0) {
        gen_set_nzcv(pTVar17,pTVar5);
      }
      else {
        local_48 = tcg_temp_new_internal_aarch64(pTVar17,TCG_TYPE_I32,false);
        pTVar6 = (TCGv_i32)((long)local_48 - (long)pTVar17);
        pTVar22 = tcg_temp_new_internal_aarch64(pTVar17,TCG_TYPE_I32,false);
        pTVar7 = (TCGv_i32)((long)pTVar22 - (long)pTVar17);
        tcg_gen_andi_i32_aarch64(pTVar17,pTVar7,pTVar17->cpu_NF,-0x80000000);
        tcg_gen_setcondi_i32_aarch64(pTVar17,TCG_COND_EQ,pTVar6,pTVar17->cpu_ZF,0);
        tcg_gen_deposit_i32_aarch64(pTVar17,pTVar7,pTVar7,pTVar6,0x1e,1);
        tcg_gen_deposit_i32_aarch64(pTVar17,pTVar7,pTVar7,pTVar17->cpu_CF,0x1d,1);
        tcg_gen_shri_i32_aarch64(pTVar17,pTVar6,pTVar17->cpu_VF,0x1f);
        tcg_gen_deposit_i32_aarch64(pTVar17,pTVar7,pTVar7,pTVar6,0x1c,1);
        tcg_gen_extu_i32_i64_aarch64(pTVar17,pTVar5,pTVar7);
        tcg_temp_free_internal_aarch64(pTVar17,pTVar22);
        tcg_temp_free_internal_aarch64(pTVar17,local_48);
      }
    case 0:
      if (a1 == (TCGLabel *)0x0) {
        return;
      }
      goto LAB_006a29ae;
    case 3:
      pTVar5 = cpu_reg_aarch64(s,reg);
      tcg_gen_op2_aarch64(pTVar17,INDEX_op_movi_i64,(TCGArg)(pTVar5 + (long)pTVar17),
                          (long)(s->current_el << 2));
      break;
    case 4:
      pTVar5 = cpu_reg_aarch64(s,reg);
      pTVar5 = clean_data_tbi(s,pTVar5);
      local_68 = (TCGTemp *)(pTVar17->cpu_env + (long)pTVar17);
      local_60 = (TCGTemp *)(pTVar5 + (long)pTVar17);
      tcg_gen_callN_aarch64(pTVar17,helper_dc_zva_aarch64,(TCGTemp *)0x0,2,&local_68);
    }
    if (a1 == (TCGLabel *)0x0) {
      return;
    }
LAB_006a29ae:
    puVar9 = s->uc;
LAB_006a29b6:
    pTVar17 = puVar9->tcg_ctx;
    *(uint *)a1 = *(uint *)a1 | 1;
LAB_006a29c9:
    tcg_gen_op1_aarch64(pTVar17,INDEX_op_set_label,(TCGArg)a1);
    return;
  }
  if (reg != 0x1f || val_00 != 0) goto switchD_006a286f_caseD_3;
  if (uVar20 != 4) {
    if (uVar20 == 3) {
      if ((uVar13 == 3) && (uVar10 - 2 < 6)) {
        pTVar17 = s->uc->tcg_ctx;
        switch(uVar10) {
        case 2:
          tcg_gen_op2_aarch64(pTVar17,INDEX_op_movi_i64,
                              (TCGArg)(pTVar17->cpu_exclusive_addr + (long)pTVar17),
                              0xffffffffffffffff);
          return;
        case 3:
          break;
        default:
          TVar11 = TCG_BAR_SC|TCG_MO_ALL;
          if ((uVar14 & 3) == 2) {
            TVar11 = TCG_BAR_SC|TCG_MO_ST_ST;
          }
          mb_type = TCG_BAR_SC|TCG_MO_LD_ST|TCG_MO_LD_LD;
          if ((uVar14 & 3) != 1) {
            mb_type = TVar11;
          }
          tcg_gen_mb_aarch64(pTVar17,mb_type);
          return;
        case 6:
          reset_btype(s);
LAB_006a2de0:
          gen_goto_tb(s,0,(s->base).pc_next);
          return;
        case 7:
          if ((uVar3 == 0) && ((s->isar->id_aa64isar1 & 0xf000000000) != 0)) {
            tcg_gen_mb_aarch64(pTVar17,TCG_BAR_SC|TCG_MO_ALL);
            goto LAB_006a2de0;
          }
        }
      }
      goto switchD_006a286f_caseD_3;
    }
    if ((uVar20 != 2) || (uVar13 != 3)) goto switchD_006a286f_caseD_3;
    iVar4 = uVar10 + uVar3 * 8;
    if (0x1e < iVar4 - 1U) {
      return;
    }
    pTVar17 = s->uc->tcg_ctx;
    switch(iVar4) {
    case 1:
      if ((((s->base).tb)->cflags & 0x80000) != 0) {
        return;
      }
      (s->base).is_jmp = DISAS_TARGET_7;
      return;
    case 2:
      if ((((s->base).tb)->cflags & 0x80000) != 0) {
        return;
      }
      (s->base).is_jmp = DISAS_TARGET_4;
      return;
    case 3:
      (s->base).is_jmp = DISAS_TARGET_2;
      return;
    default:
      goto switchD_006a25c2_caseD_4;
    case 7:
      if (s->pauth_active != true) {
        return;
      }
      local_68 = (TCGTemp *)(pTVar17->cpu_env + (long)pTVar17);
      local_60 = (TCGTemp *)(pTVar17->cpu_X[0x1e] + (long)pTVar17);
      pcVar15 = helper_xpaci_aarch64;
      iVar4 = 2;
      goto LAB_006a32bb;
    case 8:
      if (s->pauth_active != true) {
        return;
      }
      pTVar1 = pTVar17->cpu_env;
      pTVar8 = pTVar17->cpu_X[0x11];
      pTVar5 = pTVar17->cpu_X[0x10];
      goto LAB_006a324d;
    case 10:
      if (s->pauth_active != true) {
        return;
      }
      pTVar1 = pTVar17->cpu_env;
      pTVar8 = pTVar17->cpu_X[0x11];
      pTVar5 = pTVar17->cpu_X[0x10];
      goto LAB_006a307a;
    case 0xc:
      if (s->pauth_active != true) {
        return;
      }
      pTVar1 = pTVar17->cpu_env;
      pTVar8 = pTVar17->cpu_X[0x11];
      pTVar5 = pTVar17->cpu_X[0x10];
      goto LAB_006a30dc;
    case 0xe:
      if (s->pauth_active != true) {
        return;
      }
      pTVar1 = pTVar17->cpu_env;
      pTVar8 = pTVar17->cpu_X[0x11];
      pTVar5 = pTVar17->cpu_X[0x10];
      goto LAB_006a3198;
    case 0x18:
      if (s->pauth_active != true) {
        return;
      }
      pTVar1 = pTVar17->cpu_env;
      pTVar5 = pTVar17->cpu_X[0x1e];
      pTVar8 = new_tmp_a64_zero_aarch64(s);
      local_58 = (TCGTemp *)(pTVar8 + (long)pTVar17);
      pcVar15 = helper_pacia_aarch64;
      local_68 = (TCGTemp *)(pTVar1 + (long)pTVar17);
      local_60 = (TCGTemp *)(pTVar5 + (long)pTVar17);
      break;
    case 0x19:
      if (s->pauth_active != true) {
        return;
      }
      pTVar1 = pTVar17->cpu_env;
      pTVar8 = pTVar17->cpu_X[0x1e];
      pTVar5 = pTVar17->cpu_X[0x1f];
LAB_006a324d:
      local_60 = (TCGTemp *)(pTVar8 + (long)pTVar17);
      local_68 = (TCGTemp *)(pTVar1 + (long)pTVar17);
      local_58 = (TCGTemp *)(pTVar5 + (long)pTVar17);
      pcVar15 = helper_pacia_aarch64;
      break;
    case 0x1a:
      if (s->pauth_active != true) {
        return;
      }
      pTVar1 = pTVar17->cpu_env;
      pTVar5 = pTVar17->cpu_X[0x1e];
      pTVar8 = new_tmp_a64_zero_aarch64(s);
      local_58 = (TCGTemp *)(pTVar8 + (long)pTVar17);
      pcVar15 = helper_pacib_aarch64;
      local_68 = (TCGTemp *)(pTVar1 + (long)pTVar17);
      local_60 = (TCGTemp *)(pTVar5 + (long)pTVar17);
      break;
    case 0x1b:
      if (s->pauth_active != true) {
        return;
      }
      pTVar1 = pTVar17->cpu_env;
      pTVar8 = pTVar17->cpu_X[0x1e];
      pTVar5 = pTVar17->cpu_X[0x1f];
LAB_006a307a:
      local_60 = (TCGTemp *)(pTVar8 + (long)pTVar17);
      local_68 = (TCGTemp *)(pTVar1 + (long)pTVar17);
      local_58 = (TCGTemp *)(pTVar5 + (long)pTVar17);
      pcVar15 = helper_pacib_aarch64;
      break;
    case 0x1c:
      if (s->pauth_active != true) {
        return;
      }
      pTVar1 = pTVar17->cpu_env;
      pTVar5 = pTVar17->cpu_X[0x1e];
      pTVar8 = new_tmp_a64_zero_aarch64(s);
      local_58 = (TCGTemp *)(pTVar8 + (long)pTVar17);
      pcVar15 = helper_autia_aarch64;
      local_68 = (TCGTemp *)(pTVar1 + (long)pTVar17);
      local_60 = (TCGTemp *)(pTVar5 + (long)pTVar17);
      break;
    case 0x1d:
      if (s->pauth_active != true) {
        return;
      }
      pTVar1 = pTVar17->cpu_env;
      pTVar8 = pTVar17->cpu_X[0x1e];
      pTVar5 = pTVar17->cpu_X[0x1f];
LAB_006a30dc:
      local_60 = (TCGTemp *)(pTVar8 + (long)pTVar17);
      local_68 = (TCGTemp *)(pTVar1 + (long)pTVar17);
      local_58 = (TCGTemp *)(pTVar5 + (long)pTVar17);
      pcVar15 = helper_autia_aarch64;
      break;
    case 0x1e:
      if (s->pauth_active != true) {
        return;
      }
      pTVar1 = pTVar17->cpu_env;
      pTVar5 = pTVar17->cpu_X[0x1e];
      pTVar8 = new_tmp_a64_zero_aarch64(s);
      local_58 = (TCGTemp *)(pTVar8 + (long)pTVar17);
      pcVar15 = helper_autib_aarch64;
      local_68 = (TCGTemp *)(pTVar1 + (long)pTVar17);
      local_60 = (TCGTemp *)(pTVar5 + (long)pTVar17);
      break;
    case 0x1f:
      if (s->pauth_active != true) {
        return;
      }
      pTVar1 = pTVar17->cpu_env;
      pTVar8 = pTVar17->cpu_X[0x1e];
      pTVar5 = pTVar17->cpu_X[0x1f];
LAB_006a3198:
      local_60 = (TCGTemp *)(pTVar8 + (long)pTVar17);
      local_68 = (TCGTemp *)(pTVar1 + (long)pTVar17);
      local_58 = (TCGTemp *)(pTVar5 + (long)pTVar17);
      pcVar15 = helper_autib_aarch64;
    }
    iVar4 = 3;
LAB_006a32bb:
    tcg_gen_callN_aarch64(pTVar17,pcVar15,local_60,iVar4,&local_68);
switchD_006a25c2_caseD_4:
    return;
  }
  pTVar17 = s->uc->tcg_ctx;
  iVar4 = uVar10 + uVar13 * 8;
  (s->base).is_jmp = DISAS_TOO_MANY;
  switch(iVar4) {
  case 0:
    if ((uVar3 == 0) && ((s->isar->id_aa64isar0 & 0xf0000000000000) != 0)) {
      tcg_gen_xori_i32_aarch64(pTVar17,pTVar17->cpu_CF,pTVar17->cpu_CF,1);
LAB_006a2bf1:
      (s->base).is_jmp = DISAS_NEXT;
      return;
    }
    break;
  case 1:
    if ((uVar3 == 0) && ((s->isar->id_aa64isar0 & 0xe0000000000000) != 0)) {
      pTVar22 = tcg_temp_new_internal_aarch64(pTVar17,TCG_TYPE_I32,false);
      tcg_gen_setcondi_i32_aarch64
                (pTVar17,TCG_COND_EQ,(TCGv_i32)((long)pTVar22 - (long)pTVar17),pTVar17->cpu_ZF,0);
      tcg_gen_op3_aarch64(pTVar17,INDEX_op_or_i32,(TCGArg)(pTVar17->cpu_NF + (long)pTVar17),
                          (TCGArg)(pTVar17->cpu_CF + (long)pTVar17),(TCGArg)pTVar22);
      tcg_gen_subi_i32_aarch64(pTVar17,pTVar17->cpu_NF,pTVar17->cpu_NF,1);
      tcg_gen_op3_aarch64(pTVar17,INDEX_op_and_i32,(TCGArg)(pTVar17->cpu_ZF + (long)pTVar17),
                          (TCGArg)pTVar22,(TCGArg)(pTVar17->cpu_CF + (long)pTVar17));
      tcg_gen_xori_i32_aarch64(pTVar17,pTVar17->cpu_ZF,pTVar17->cpu_ZF,1);
      tcg_gen_andc_i32_aarch64
                (pTVar17,pTVar17->cpu_VF,(TCGv_i32)((long)pTVar22 - (long)pTVar17),pTVar17->cpu_CF);
      tcg_gen_op2_aarch64(pTVar17,INDEX_op_neg_i32,(TCGArg)(pTVar17->cpu_VF + (long)pTVar17),
                          (TCGArg)(pTVar17->cpu_VF + (long)pTVar17));
      tcg_gen_op3_aarch64(pTVar17,INDEX_op_or_i32,(TCGArg)(pTVar17->cpu_CF + (long)pTVar17),
                          (TCGArg)(pTVar17->cpu_CF + (long)pTVar17),(TCGArg)pTVar22);
      tcg_temp_free_internal_aarch64(pTVar17,pTVar22);
      (s->base).is_jmp = DISAS_NEXT;
      return;
    }
    break;
  case 2:
    if ((uVar3 == 0) && ((s->isar->id_aa64isar0 & 0xe0000000000000) != 0)) {
      tcg_gen_sari_i32_aarch64(pTVar17,pTVar17->cpu_VF,pTVar17->cpu_VF,0x1f);
      tcg_gen_andc_i32_aarch64(pTVar17,pTVar17->cpu_CF,pTVar17->cpu_CF,pTVar17->cpu_VF);
      tcg_gen_andc_i32_aarch64(pTVar17,pTVar17->cpu_ZF,pTVar17->cpu_ZF,pTVar17->cpu_VF);
      tcg_gen_op2_aarch64(pTVar17,INDEX_op_movi_i32,(TCGArg)(pTVar17->cpu_NF + (long)pTVar17),0);
      tcg_gen_op2_aarch64(pTVar17,INDEX_op_movi_i32,(TCGArg)(pTVar17->cpu_VF + (long)pTVar17),0);
      goto LAB_006a2bf1;
    }
    break;
  case 3:
    if (((s->isar->id_aa64mmfr2 & 0xf0) == 0) || (s->current_el == 0)) break;
    bits = 0x800000;
    goto LAB_006a2c24;
  case 4:
    if (((s->isar->id_aa64mmfr1 & 0xf00000) == 0) || (s->current_el == 0)) break;
    bits = 0x400000;
LAB_006a2c24:
    if ((insn >> 8 & 1) == 0) {
      clear_pstate_bits(pTVar17,bits);
    }
    else {
      set_pstate_bits(pTVar17,bits);
    }
    pTVar6 = tcg_const_i32_aarch64(pTVar17,s->current_el);
    local_68 = (TCGTemp *)(pTVar17->cpu_env + (long)pTVar17);
    local_60 = (TCGTemp *)(pTVar6 + (long)pTVar17);
    pcVar15 = helper_rebuild_hflags_a64_aarch64;
LAB_006a2f3a:
    pTVar22 = local_60;
    tcg_gen_callN_aarch64(pTVar17,pcVar15,(TCGTemp *)0x0,2,&local_68);
    tcg_temp_free_internal_aarch64(pTVar17,pTVar22);
    return;
  case 5:
    if (s->current_el == 0) break;
    pTVar6 = tcg_const_i32_aarch64(pTVar17,uVar14 & 1);
    local_68 = (TCGTemp *)(pTVar17->cpu_env + (long)pTVar17);
    local_60 = (TCGTemp *)(pTVar6 + (long)pTVar17);
    pcVar15 = helper_msr_i_spsel_aarch64;
    goto LAB_006a2f3a;
  default:
    if (iVar4 == 0x1e) {
      pTVar6 = tcg_const_i32_aarch64(pTVar17,uVar3);
      local_68 = (TCGTemp *)(pTVar17->cpu_env + (long)pTVar17);
      local_60 = (TCGTemp *)(pTVar6 + (long)pTVar17);
      pcVar15 = helper_msr_i_daifset_aarch64;
      goto LAB_006a2f3a;
    }
    if (iVar4 == 0x1f) {
      pTVar6 = tcg_const_i32_aarch64(pTVar17,uVar3);
      local_68 = (TCGTemp *)(pTVar17->cpu_env + (long)pTVar17);
      local_60 = (TCGTemp *)(pTVar6 + (long)pTVar17);
      tcg_gen_callN_aarch64(pTVar17,helper_msr_i_daifclear_aarch64,(TCGTemp *)0x0,2,&local_68);
      tcg_temp_free_internal_aarch64(pTVar17,(TCGTemp *)(pTVar6 + (long)pTVar17));
      (s->base).is_jmp = DISAS_TARGET_1;
      return;
    }
  }
switchD_006a286f_caseD_3:
  unallocated_encoding_aarch64(s);
  return;
}

Assistant:

static void disas_system(DisasContext *s, uint32_t insn)
{
    unsigned int l, op0, op1, crn, crm, op2, rt;
    l = extract32(insn, 21, 1);
    op0 = extract32(insn, 19, 2);
    op1 = extract32(insn, 16, 3);
    crn = extract32(insn, 12, 4);
    crm = extract32(insn, 8, 4);
    op2 = extract32(insn, 5, 3);
    rt = extract32(insn, 0, 5);

    if (op0 == 0) {
        if (l || rt != 31) {
            unallocated_encoding(s);
            return;
        }
        switch (crn) {
        case 2: /* HINT (including allocated hints like NOP, YIELD, etc) */
            handle_hint(s, insn, op1, op2, crm);
            break;
        case 3: /* CLREX, DSB, DMB, ISB */
            handle_sync(s, insn, op1, op2, crm);
            break;
        case 4: /* MSR (immediate) */
            handle_msr_i(s, insn, op1, op2, crm);
            break;
        default:
            unallocated_encoding(s);
            break;
        }
        return;
    }
    handle_sys(s, insn, l, op0, op1, op2, crn, crm, rt);
}